

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

bool __thiscall llvm::detail::IEEEFloat::convertFromStringSpecials(IEEEFloat *this,StringRef str)

{
  int iVar1;
  bool bVar2;
  long *__s1;
  
  __s1 = (long *)str.Data;
  switch(str.Length) {
  case 3:
    iVar1 = bcmp(__s1,"inf",3);
    if (iVar1 != 0) {
      iVar1 = bcmp(__s1,"nan",3);
      if ((iVar1 != 0) && (iVar1 = bcmp(__s1,"NaN",3), iVar1 != 0)) {
        return false;
      }
      bVar2 = false;
LAB_00156a75:
      makeNaN(this,false,bVar2,(APInt *)0x0);
      return true;
    }
    break;
  case 4:
    if ((int)*__s1 != 0x666e492b) {
      if (((int)*__s1 != 0x666e692d) && ((int)*__s1 != 0x666e492d)) {
        if (((int)*__s1 != 0x6e616e2d) && ((int)*__s1 != 0x4e614e2d)) {
          return false;
        }
        bVar2 = true;
        goto LAB_00156a75;
      }
      goto LAB_00156a9f;
    }
    break;
  default:
    return false;
  case 8:
    if (*__s1 != 0x5954494e49464e49) {
      return false;
    }
    break;
  case 9:
    iVar1 = bcmp(__s1,"-INFINITY",9);
    if (iVar1 != 0) {
      return false;
    }
LAB_00156a9f:
    bVar2 = true;
    goto LAB_00156aa5;
  }
  bVar2 = false;
LAB_00156aa5:
  makeInf(this,bVar2);
  return true;
}

Assistant:

bool IEEEFloat::convertFromStringSpecials(StringRef str) {
  if (str.equals("inf") || str.equals("INFINITY") || str.equals("+Inf")) {
    makeInf(false);
    return true;
  }

  if (str.equals("-inf") || str.equals("-INFINITY") || str.equals("-Inf")) {
    makeInf(true);
    return true;
  }

  if (str.equals("nan") || str.equals("NaN")) {
    makeNaN(false, false);
    return true;
  }

  if (str.equals("-nan") || str.equals("-NaN")) {
    makeNaN(false, true);
    return true;
  }

  return false;
}